

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O3

int link_get_initial_delivery_count(LINK_HANDLE link,sequence_no *initial_delivery_count)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if (link == (LINK_HANDLE)0x0 || initial_delivery_count == (sequence_no *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x418;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                ,"link_get_initial_delivery_count",0x417,1,
                "Bad arguments: link = %p, initial_delivery_count = %p",link,initial_delivery_count)
      ;
    }
  }
  else {
    *initial_delivery_count = link->initial_delivery_count;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int link_get_initial_delivery_count(LINK_HANDLE link, sequence_no* initial_delivery_count)
{
    int result;

    if ((link == NULL) ||
        (initial_delivery_count == NULL))
    {
        LogError("Bad arguments: link = %p, initial_delivery_count = %p",
            link, initial_delivery_count);
        result = MU_FAILURE;
    }
    else
    {
        *initial_delivery_count = link->initial_delivery_count;
        result = 0;
    }

    return result;
}